

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O2

void __thiscall
msgpack::v2::detail::create_object_visitor::create_object_visitor
          (create_object_visitor *this,unpack_reference_func f,void *user_data,unpack_limit *limit)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  object *local_18;
  
  this->m_func = f;
  this->m_user_data = user_data;
  sVar1 = limit->map_;
  sVar2 = limit->str_;
  sVar3 = limit->bin_;
  sVar4 = limit->ext_;
  sVar5 = limit->depth_;
  (this->m_limit).array_ = limit->array_;
  (this->m_limit).map_ = sVar1;
  (this->m_limit).str_ = sVar2;
  (this->m_limit).bin_ = sVar3;
  (this->m_limit).ext_ = sVar4;
  (this->m_limit).depth_ = sVar5;
  (this->m_obj).super_object.type = NIL;
  (this->m_stack).super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_stack).super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_stack).super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>::reserve
            (&this->m_stack,0x20);
  local_18 = &this->m_obj;
  std::vector<msgpack::v2::object*,std::allocator<msgpack::v2::object*>>::
  emplace_back<msgpack::v2::object*>
            ((vector<msgpack::v2::object*,std::allocator<msgpack::v2::object*>> *)&this->m_stack,
             &local_18);
  return;
}

Assistant:

create_object_visitor(unpack_reference_func f, void* user_data, unpack_limit const& limit)
        :m_func(f), m_user_data(user_data), m_limit(limit) {
        m_stack.reserve(MSGPACK_EMBED_STACK_SIZE);
        m_stack.push_back(&m_obj);
    }